

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

ChVector2<double> __thiscall
chrono::ChFile_ps::TransPt(ChFile_ps *this,ChVector2<double> *mfrom,Space space)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVector2<double> *v_p;
  double *in_RDI;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double in_XMM1_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChVector2<double> CVar14;
  undefined1 auVar11 [16];
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = mfrom->m_data[0];
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  auVar6 = vandpd_avx512vl(auVar8,auVar6);
  if (1e+20 < auVar6._0_8_) {
    mfrom->m_data[0] = 0.0;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = mfrom->m_data[1];
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar6 = vandpd_avx512vl(auVar9,auVar5);
  if (1e+20 < auVar6._0_8_) {
    mfrom->m_data[1] = 0.0;
  }
  dVar7 = mfrom->m_data[0];
  if (space == GRAPH) {
    in_XMM1_Qa = mfrom->m_data[1];
    *in_RDI = 0.0;
    in_RDI[1] = 0.0;
    dVar1 = (this->Gs_p).m_data[1];
    dVar2 = (this->G_p).m_data[1];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->Gz).m_data[0];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar7 - (this->Gc_g).m_data[0];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
    auVar6 = vfmadd132sd_fma(auVar10,auVar13,auVar3);
    *in_RDI = auVar6._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this->Gz).m_data[1];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = in_XMM1_Qa - (this->Gc_g).m_data[1];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1 * 0.5 + dVar2;
    auVar6 = vfmadd132sd_fma(auVar11,auVar12,auVar4);
    dVar7 = auVar6._0_8_;
  }
  else {
    *in_RDI = dVar7;
    dVar7 = mfrom->m_data[1];
  }
  in_RDI[1] = dVar7;
  CVar14.m_data[1] = in_XMM1_Qa;
  CVar14.m_data[0] = dVar7;
  return (ChVector2<double>)CVar14.m_data;
}

Assistant:

ChVector2<> ChFile_ps::TransPt(ChVector2<> mfrom, Space space) const {
    if ((mfrom.x() > 1.e+20) || (mfrom.x() < -1.e+20))
        mfrom.x() = 0;
    if ((mfrom.y() > 1.e+20) || (mfrom.y() < -1.e+20))
        mfrom.y() = 0;

    switch (space) {
        case Space::PAGE:
            return mfrom;
        case Space::GRAPH:
            return To_page_from_graph(mfrom);
        default:
            return mfrom;
    }
}